

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcs.c
# Opt level: O2

void mcswrt(mcscxdef *ctx,mcsdsdef *desc,uchar *buf,ushort bufl)

{
  int iVar1;
  size_t sVar2;
  undefined6 in_register_0000000a;
  int iVar3;
  errcxdef *ctx_00;
  bool bVar4;
  
  desc->mcsdsosz = bufl;
  iVar3 = 2;
  do {
    bVar4 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar4) {
      ctx_00 = ctx->mcscxerr;
      iVar3 = 7;
LAB_002176d4:
      errsigf(ctx_00,"TADS",iVar3);
    }
    iVar1 = fseek((FILE *)ctx->mcscxfp,desc->mcsdsptr,0);
    if (iVar1 != 0) {
      ctx_00 = ctx->mcscxerr;
      iVar3 = 2;
      goto LAB_002176d4;
    }
    sVar2 = fwrite(buf,CONCAT62(in_register_0000000a,bufl) & 0xffffffff,1,(FILE *)ctx->mcscxfp);
    if (sVar2 == 1) {
      return;
    }
    mcscompact(ctx);
  } while( true );
}

Assistant:

void mcswrt(mcscxdef *ctx, mcsdsdef *desc, uchar *buf, ushort bufl)
{
    int tries;
    
    desc->mcsdsosz = bufl;
    
    for (tries = 0 ; tries < 2 ; ++tries)
    {
        /* attempt to write the object to the swap file */
        if (osfseek(ctx->mcscxfp, desc->mcsdsptr, OSFSK_SET))
            errsig(ctx->mcscxerr, ERR_FSEEK);
        if (!osfwb(ctx->mcscxfp, buf, (size_t)bufl))
            return;
        
        /* couldn't write it; compact the swap file */
        mcscompact(ctx);
    }
    
    /* couldn't write to swap file, even after compacting it */
    errsig(ctx->mcscxerr, ERR_FWRITE);
}